

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int base64_decode(char *in_buf,uint in_size,void *out_buf,uint out_size,BASE64_OPTIONS *options)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  BASE64_OPTIONS *pBVar11;
  uint8_t table [256];
  
  pBVar11 = &base64_def_options;
  if (options != (BASE64_OPTIONS *)0x0) {
    pBVar11 = options;
  }
  if ((((in_size & 3) == 0) && (in_size != 0)) && (cVar2 = pBVar11->pad, cVar2 != '\0')) {
    if (in_buf[in_size - 1] == cVar2) {
      in_size = in_size - 1;
    }
    if (in_buf[in_size - 1] == cVar2) {
      in_size = in_size - 1;
    }
  }
  memset(table,0xff,0x100);
  for (lVar5 = 0; lVar5 != 0x3e; lVar5 = lVar5 + 1) {
    table["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[lVar5]] = (uint8_t)lVar5;
  }
  table[pBVar11->ch62] = '>';
  table[pBVar11->ch63] = '?';
  uVar9 = 0;
  while (in_size != uVar9) {
    pcVar1 = in_buf + uVar9;
    uVar9 = uVar9 + 1;
    if (table[*pcVar1] == 0xff) {
      return -0x16;
    }
  }
  uVar8 = (in_size >> 2) * 3;
  switch(in_size & 3) {
  case 1:
    return -0x16;
  case 2:
    if ((table[in_buf[in_size - 1]] & 0x4f) != 0) {
      return -0x16;
    }
    uVar8 = uVar8 + 1;
    break;
  case 3:
    if ((table[in_buf[in_size - 1]] & 0xc3) != 0) {
      return -0x16;
    }
    uVar8 = uVar8 + 2;
  }
  if (out_buf == (void *)0x0) {
    return uVar8;
  }
  if (out_size < uVar8) {
    return -0x69;
  }
  lVar5 = 1;
  for (uVar9 = 4; uVar9 <= in_size; uVar9 = uVar9 + 4) {
    bVar7 = table[in_buf[uVar9 - 3]];
    bVar3 = table[in_buf[uVar9 - 2]];
    bVar4 = table[in_buf[uVar9 - 1]];
    *(byte *)((long)out_buf + lVar5 + -1) =
         (byte)(((uint)table[in_buf[uVar9 - 4]] << 0x12) >> 0x10) |
         (byte)(((uint)bVar7 << 0xc) >> 0x10);
    *(byte *)((long)out_buf + lVar5) =
         (byte)(((uint)bVar7 << 0xc) >> 8) | (byte)(((ulong)bVar3 << 6) >> 8);
    *(byte *)((long)out_buf + lVar5 + 1) = (byte)((ulong)bVar3 << 6) | bVar4;
    lVar5 = lVar5 + 3;
  }
  uVar8 = (uint)lVar5;
  if ((int)uVar9 - in_size == 2) {
    bVar7 = (byte)(((uint)table[in_buf[uVar9 - 3]] << 0xc) >> 0x10) |
            (byte)(((uint)table[in_buf[uVar9 - 4]] << 0x12) >> 0x10);
    iVar10 = 1;
    uVar6 = uVar8 - 1;
  }
  else {
    if ((int)uVar9 - in_size != 1) {
      return uVar8 - 1;
    }
    bVar7 = (byte)(((uint)table[in_buf[uVar9 - 2]] << 6) >> 8) |
            (byte)(((uint)table[in_buf[uVar9 - 3]] << 0xc) >> 8);
    *(byte *)((long)out_buf + lVar5 + -1) =
         (byte)(((uint)table[in_buf[uVar9 - 4]] << 0x12) >> 0x10) |
         (byte)(((uint)table[in_buf[uVar9 - 3]] << 0xc) >> 0x10);
    iVar10 = 2;
    uVar6 = uVar8;
  }
  *(byte *)((long)out_buf + (ulong)uVar6) = bVar7;
  return uVar8 + iVar10 + -1;
}

Assistant:

int
base64_decode(const char* in_buf, unsigned in_size,
              void* out_buf, unsigned out_size,
              const BASE64_OPTIONS* options)
{
    uint8_t table[256];
    int i;
    const char* in = in_buf;
    uint8_t* out = (uint8_t*) out_buf;
    unsigned out_size_needed;
    unsigned in_off = 0;
    unsigned out_off = 0;
    unsigned v;

    if(options == NULL)
        options = &base64_def_options;

    /* Ignore any padding. */
    if(options->pad != '\0'  &&  in_size > 0  &&  in_size % 4 == 0) {
        /* Valid Base64 can have up to two characters of padding. */
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
    }

    /* Build table. */
    memset(table, 0xff, 256);
    for(i = 0; i < 62; i++)
        table[(int) base64_table_core[i]] = i;
    table[(int) options->ch62] = 62;
    table[(int) options->ch63] = 63;

    /* Validate the input. */
    for(in_off = 0; in_off < in_size; in_off++) {
        if(table[(int) in[in_off]] == 0xff)
            return -EINVAL;
    }

    /* Every four characters are decoded into 3 bytes of output.
     * Note that on the end only certain values may appear from encoding
     * a tail of one or two bytes in base64_encode(). */
    out_size_needed = (in_size / 4) * 3;
    switch(in_size % 4) {
        case 0:
            break;
        case 1:
            return -EINVAL;
            break;

        case 2:
            if(table[(int) in[in_size-1]] & 0x4f)
                return -EINVAL;
            out_size_needed += 1;
            break;

        case 3:
            if(table[(int) in[in_size-1]] & 0xc3)
                return -EINVAL;
            out_size_needed += 2;
            break;
    }

    if(out_buf == NULL)
        return out_size_needed;

    /* Check we have enough space in the output. */
    if(out_size < out_size_needed)
        return -ENOBUFS;

    /* Main loop. */
    in_off = 0;
    while(in_off + 4 <= in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        v |= (unsigned)table[(int) in[in_off++]];

        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
        out[out_off++] = (v      ) & 0xff;
    }

    if(in_off + 2 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        out[out_off++] = (v >> 16) & 0xff;
    } else if(in_off + 3 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
    }

    return out_off;
}